

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Bounds3f * __thiscall pbrt::Curve::Bounds(Bounds3f *__return_storage_ptr__,Curve *this)

{
  Float FVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  size_t in_RCX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  span<const_pbrt::Point3<float>_> cp;
  Bounds3f objBounds;
  Bounds3<float> local_38;
  Bounds3<float> *b;
  
  cp.n = in_RCX;
  cp.ptr = (Point3<float> *)0x4;
  BoundCubicBezier(&objBounds,(pbrt *)this->common->cpObj,cp,this->uMin,this->uMax);
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  uVar2 = this->uMin;
  uVar3 = this->uMax;
  auVar6._4_4_ = uVar3;
  auVar6._0_4_ = uVar2;
  auVar6._8_8_ = 0;
  auVar7 = vsubps_avx(auVar7,auVar6);
  FVar1 = this->common->width[1];
  auVar5._4_4_ = FVar1;
  auVar5._0_4_ = FVar1;
  auVar5._8_4_ = FVar1;
  auVar5._12_4_ = FVar1;
  auVar5 = vmulps_avx512vl(auVar6,auVar5);
  FVar1 = this->common->width[0];
  auVar4._4_4_ = FVar1;
  auVar4._0_4_ = FVar1;
  auVar4._8_4_ = FVar1;
  auVar4._12_4_ = FVar1;
  auVar5 = vfmadd231ps_avx512vl(auVar5,auVar7,auVar4);
  auVar7 = vmovshdup_avx(auVar5);
  auVar7 = vmaxss_avx(auVar7,auVar5);
  Expand<float,float>(&local_38,(pbrt *)&objBounds,b,auVar7._0_4_ * 0.5);
  objBounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
       local_38.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  objBounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       local_38.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  objBounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_38.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  objBounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_38.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  objBounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_38.pMin.super_Tuple3<pbrt::Point3,_float>.z;
  objBounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
       local_38.pMax.super_Tuple3<pbrt::Point3,_float>.x;
  Transform::operator()(__return_storage_ptr__,this->common->renderFromObject,&objBounds);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f Curve::Bounds() const {
    pstd::span<const Point3f> cpSpan(common->cpObj);
    Bounds3f objBounds = BoundCubicBezier(cpSpan, uMin, uMax);
    // Expand _objBounds_ by maximum curve width over $u$ range
    Float width[2] = {Lerp(uMin, common->width[0], common->width[1]),
                      Lerp(uMax, common->width[0], common->width[1])};
    objBounds = Expand(objBounds, std::max(width[0], width[1]) * 0.5f);

    return (*common->renderFromObject)(objBounds);
}